

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O3

int __thiscall
asio::detail::reactive_socket_service_base::listen
          (reactive_socket_service_base *this,int __fd,int __n)

{
  error_code *this_00;
  int iVar1;
  int *piVar2;
  error_category *peVar3;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  int iVar4;
  undefined4 in_register_00000034;
  int __fd_00;
  
  __fd_00 = *(int *)CONCAT44(in_register_00000034,__fd);
  this_00 = (error_code *)CONCAT71(in_register_00000009,in_CL);
  if (__fd_00 == -1) {
    std::error_code::operator=(this_00,bad_descriptor);
    iVar4 = this_00->_M_value;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    iVar1 = ::listen(__fd_00,__n);
    iVar4 = *piVar2;
    if (system_category()::instance == '\0') {
      listen(__fd_00,__n);
    }
    this_00->_M_value = iVar4;
    this_00->_M_cat = (error_category *)&system_category()::instance;
    if (iVar1 == 0) {
      peVar3 = (error_category *)std::_V2::system_category();
      this_00->_M_value = 0;
      iVar4 = 0;
      this_00->_M_cat = peVar3;
    }
  }
  return iVar4;
}

Assistant:

asio::error_code listen(base_implementation_type& impl,
      int backlog, asio::error_code& ec)
  {
    socket_ops::listen(impl.socket_, backlog, ec);
    return ec;
  }